

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O1

void __thiscall Application::fail(Application *this)

{
  Log *pLVar1;
  Member *pMVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  Params *this_00;
  long lVar6;
  
  if (this->par->DROP_MSG != 0) {
    iVar4 = Params::getcurrtime(this->par);
    if (iVar4 == 0x32) {
      this->par->dropmsg = 1;
    }
  }
  if (this->par->SINGLE_FAILURE != 0) {
    iVar4 = Params::getcurrtime(this->par);
    if (iVar4 == 100) {
      iVar4 = rand();
      iVar4 = iVar4 % this->par->EN_GPSZ;
      pLVar1 = this->log;
      pMVar2 = this->mp1[iVar4]->memberNode;
      uVar5 = Params::getcurrtime(this->par);
      Log::LOG(pLVar1,&pMVar2->addr,"Node failed at time=%d",(ulong)uVar5);
      this->mp1[iVar4]->memberNode->bFailed = true;
      goto LAB_00102d40;
    }
  }
  iVar4 = Params::getcurrtime(this->par);
  if (iVar4 == 100) {
    iVar4 = rand();
    this_00 = this->par;
    uVar3 = (long)iVar4 % (long)this_00->EN_GPSZ;
    if (1 < this_00->EN_GPSZ) {
      iVar4 = (int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1;
      lVar6 = (long)iVar4;
      do {
        pLVar1 = this->log;
        pMVar2 = this->mp1[lVar6]->memberNode;
        uVar5 = Params::getcurrtime(this_00);
        Log::LOG(pLVar1,&pMVar2->addr,"Node failed at time = %d",(ulong)uVar5);
        this->mp1[lVar6]->memberNode->bFailed = true;
        lVar6 = lVar6 + 1;
        this_00 = this->par;
      } while (lVar6 < this_00->EN_GPSZ / 2 + iVar4);
    }
  }
LAB_00102d40:
  if (this->par->DROP_MSG != 0) {
    iVar4 = Params::getcurrtime(this->par);
    if (iVar4 == 300) {
      this->par->dropmsg = 0;
    }
  }
  return;
}

Assistant:

void Application::fail() {
	int i, removed;

	// fail half the members at time t=400
	if( par->DROP_MSG && par->getcurrtime() == 50 ) {
		par->dropmsg = 1;
	}

	if( par->SINGLE_FAILURE && par->getcurrtime() == 100 ) {
		removed = (rand() % par->EN_GPSZ);
		#ifdef DEBUGLOG
		log->LOG(&mp1[removed]->getMemberNode()->addr, "Node failed at time=%d", par->getcurrtime());
		#endif
		mp1[removed]->getMemberNode()->bFailed = true;
	}
	else if( par->getcurrtime() == 100 ) {
		removed = rand() % par->EN_GPSZ/2;
		for ( i = removed; i < removed + par->EN_GPSZ/2; i++ ) {
			#ifdef DEBUGLOG
			log->LOG(&mp1[i]->getMemberNode()->addr, "Node failed at time = %d", par->getcurrtime());
			#endif
			mp1[i]->getMemberNode()->bFailed = true;
		}
	}

	if( par->DROP_MSG && par->getcurrtime() == 300) {
		par->dropmsg=0;
	}

}